

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.cpp
# Opt level: O0

void __thiscall StringifyTest_FilterBranches_Test::TestBody(StringifyTest_FilterBranches_Test *this)

{
  pointer *this_00;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_698;
  Message local_690;
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  local_688;
  undefined1 local_670 [8];
  AssertionResult gtest_ar;
  Substrings result;
  Substrings substrings;
  HashStringifyWalker stringify;
  allocator<char> local_421;
  string local_420;
  undefined1 local_400 [8];
  Module wasm;
  StringifyTest_FilterBranches_Test *this_local;
  
  wasm.tagsMap._M_h._M_single_bucket = (__node_base_ptr)this;
  ::wasm::Module::Module((Module *)local_400);
  pcVar2 = TestBody::branchesModuleText;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_420,pcVar2,&local_421);
  PrintTest::parseWast(&this->super_StringifyTest,(Module *)local_400,&local_420);
  std::__cxx11::string::~string((string *)&local_420);
  std::allocator<char>::~allocator(&local_421);
  this_00 = &substrings.
             super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  memset(this_00,0,0x1f8);
  ::wasm::HashStringifyWalker::HashStringifyWalker((HashStringifyWalker *)this_00);
  ::wasm::
  Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
  ::walkModule((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)&substrings.
                   super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(Module *)local_400);
  ::wasm::StringifyProcessor::repeatSubstrings
            ((vector *)
             &result.
              super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::wasm::StringifyProcessor::filterBranches
            ((vector *)&gtest_ar.message_,
             (vector *)
             &result.
              super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_688.
  super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_688.
  super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_688.
  super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ::vector(&local_688);
  testing::internal::EqHelper::
  Compare<std::vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>,_std::vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>,_nullptr>
            ((EqHelper *)local_670,"result","(std::vector<SuffixTree::RepeatedSubstring>{})",
             (vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
              *)&gtest_ar.message_,&local_688);
  std::
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ::~vector(&local_688);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_670);
  if (!bVar1) {
    testing::Message::Message(&local_690);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_670);
    testing::internal::AssertHelper::AssertHelper
              (&local_698,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/stringify.cpp"
               ,0x173,pcVar2);
    testing::internal::AssertHelper::operator=(&local_698,&local_690);
    testing::internal::AssertHelper::~AssertHelper(&local_698);
    testing::Message::~Message(&local_690);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
  std::
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ::~vector((vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
             *)&gtest_ar.message_);
  std::
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ::~vector((vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
             *)&result.
                super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::wasm::HashStringifyWalker::~HashStringifyWalker
            ((HashStringifyWalker *)
             &substrings.
              super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::wasm::Module::~Module((Module *)local_400);
  return;
}

Assistant:

TEST_F(StringifyTest, FilterBranches) {
  static auto branchesModuleText = R"wasm(
  (module
    (func $a
      (block $top
        (br $top)
      )
    )
    (func $b
      (block $top
        (br $top)
      )
    )
   )
  )wasm";
  Module wasm;
  parseWast(wasm, branchesModuleText);
  HashStringifyWalker stringify = HashStringifyWalker();
  stringify.walkModule(&wasm);
  auto substrings = StringifyProcessor::repeatSubstrings(stringify.hashString);
  auto result = StringifyProcessor::filterBranches(substrings, stringify.exprs);

  EXPECT_EQ(result, (std::vector<SuffixTree::RepeatedSubstring>{}));
}